

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObject::~QObject(QObject *this)

{
  Connection *pCVar1;
  Connection *o;
  bool bVar2;
  int iVar3;
  QObjectPrivate *pQVar4;
  QThread *pQVar5;
  Type this_00;
  Type pCVar6;
  QObjectPrivate *pQVar7;
  Type pCVar8;
  Type pQVar9;
  Type pCVar10;
  ConnectionData *this_01;
  QObjectPrivate *pQVar11;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool locksAreTheSame;
  QSlotObjectBase *slotObj;
  ConnectionData *senderData;
  bool needToUnlock_1;
  QBasicMutex *m_1;
  QObject *sender;
  Connection *node;
  bool needToUnlock;
  QBasicMutex *m;
  Connection *c;
  ConnectionList *connectionList;
  int signal;
  int receiverCount;
  QBasicMutex *signalSlotMutex;
  ConnectionData *cd;
  ExternalRefCountData *sharedRefcount;
  QThreadPrivate *privThread;
  QThread *ownThread;
  QObjectPrivate *d;
  QMutexLocker<QBasicMutex> locker;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  Type in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  undefined1 uVar12;
  QObjectPrivate *in_stack_fffffffffffffea0;
  QThreadPrivate *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  QObjectPrivate *in_stack_fffffffffffffeb8;
  Connection *c_00;
  ConnectionData *in_stack_fffffffffffffec0;
  QObject *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  StaticMetaCallFunction local_d8;
  int local_88;
  __sighandler_t local_48 [2];
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  undefined4 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00be7380;
  pQVar4 = d_func((QObject *)0x3ec527);
  *(uint *)&(pQVar4->super_QObjectData).field_0x30 =
       *(uint *)&(pQVar4->super_QObjectData).field_0x30 & 0xfffffffb | 4;
  *(uint *)&(pQVar4->super_QObjectData).field_0x30 =
       *(uint *)&(pQVar4->super_QObjectData).field_0x30 & 0xfffffffd;
  bVar2 = QBindingStorage::isValid(&(pQVar4->super_QObjectData).bindingStorage);
  if ((!bVar2) && (pQVar5 = thread((QObject *)0x3ec579), pQVar5 != (QThread *)0x0)) {
    QObjectPrivate::get((QObject *)0x3ec5ab);
    QThreadPrivate::removeObjectWithPendingBindingStatusChange
              (in_stack_fffffffffffffea8,(QObject *)in_stack_fffffffffffffea0);
  }
  QObjectPrivate::clearBindingStorage((QObjectPrivate *)0x3ec5ed);
  this_00 = QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>::loadRelaxed
                      ((QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData> *)0x3ec600);
  if (this_00 != (Type)0x0) {
    iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x3ec628);
    if (0 < iVar3) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffea0,
                 (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      QMessageLogger::warning
                (&local_38,
                 "QObject: shared QObject was deleted directly. The program is malformed and may crash."
                );
    }
    QBasicAtomicInteger<int>::storeRelaxed
              ((QBasicAtomicInteger<int> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x3ec67d);
    if ((!bVar2) && (this_00 != (ExternalRefCountData *)0x0)) {
      QtSharedPointer::ExternalRefCountData::~ExternalRefCountData(this_00);
      QtSharedPointer::ExternalRefCountData::operator_delete((void *)0x3ec6a8);
    }
  }
  if (((*(uint *)&(pQVar4->super_QObjectData).field_0x30 >> 10 & 1) == 0) &&
     (bVar2 = QObjectPrivate::isSignalConnected
                        (in_stack_fffffffffffffeb8,(uint)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x18,0)), bVar2)) {
    destroyed((QObject *)0x3ec6f6,
              (QObject *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  }
  if ((((*(uint *)&(pQVar4->super_QObjectData).field_0x30 >> 3 & 1) == 0) &&
      ((pQVar4->field_3).currentChildBeingDeleted != (QObject *)0x0)) &&
     (QAbstractDeclarativeData::destroyed !=
      (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr *)0x0)) {
    (*QAbstractDeclarativeData::destroyed)((pQVar4->field_3).declarativeData,in_RDI);
  }
  pCVar6 = QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadAcquire
                     ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ec761);
  if (pCVar6 != (Type)0x0) {
    if (pCVar6->currentSender != (Sender *)0x0) {
      QObjectPrivate::Sender::receiverDeleted(pCVar6->currentSender);
      pCVar6->currentSender = (Sender *)0x0;
    }
    pQVar7 = (QObjectPrivate *)signalSlotLock(in_RDI);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffe90,
               (QBasicMutex *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    iVar3 = QObjectPrivate::ConnectionData::signalVectorCount(in_stack_fffffffffffffe90);
    in_stack_fffffffffffffeec = iVar3;
    for (local_88 = -1; local_88 < iVar3; local_88 = local_88 + 1) {
      in_stack_fffffffffffffee0 =
           (QObject *)
           QObjectPrivate::ConnectionData::connectionsForSignal
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      while (pCVar8 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadRelaxed
                                ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3ec873),
            pCVar8 != (Type)0x0) {
        pQVar9 = QBasicAtomicPointer<QObject>::loadRelaxed((QBasicAtomicPointer<QObject> *)0x3ec89b)
        ;
        signalSlotLock(pQVar9);
        bVar2 = QOrderedMutexLocker::relock
                          ((QBasicMutex *)in_stack_fffffffffffffe90,
                           (QBasicMutex *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        pCVar10 = QBasicAtomicPointer<QObjectPrivate::Connection>::loadAcquire
                            ((QBasicAtomicPointer<QObjectPrivate::Connection> *)0x3ec8f9);
        if ((pCVar8 == pCVar10) &&
           (pQVar9 = QBasicAtomicPointer<QObject>::loadAcquire
                               ((QBasicAtomicPointer<QObject> *)0x3ec917), pQVar9 != (Type)0x0)) {
          QObjectPrivate::ConnectionData::removeConnection
                    (in_stack_fffffffffffffec0,(Connection *)in_stack_fffffffffffffeb8);
        }
        if (bVar2) {
          QBasicMutex::unlock((QBasicMutex *)in_stack_fffffffffffffea0);
        }
      }
    }
    while (pCVar1 = pCVar6->senders, pCVar1 != (Connection *)0x0) {
      o = (Connection *)pCVar1->sender;
      c_00 = o;
      iVar3 = (*(code *)(((o->super_ConnectionOrSignalVector).field_0.next)->
                        super_ConnectionOrSignalVector).field_0)();
      this_01 = (ConnectionData *)CONCAT44(extraout_var,iVar3);
      local_48[0] = QMetaObjectPrivate::signal
                              (iVar3,(__sighandler_t)
                                     (ulong)(uint)((*(int *)&pCVar1->field_0x54 << 5) >> 5));
      (*(code *)(c_00->super_ConnectionOrSignalVector).field_0.next[1].
                super_ConnectionOrSignalVector.field_0)(c_00,local_48);
      pQVar11 = (QObjectPrivate *)signalSlotLock((QObject *)o);
      in_stack_fffffffffffffea0 = pQVar11;
      bVar2 = QOrderedMutexLocker::relock
                        ((QBasicMutex *)in_stack_fffffffffffffe90,
                         (QBasicMutex *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      if (pCVar1 == pCVar6->senders) {
        uVar12 = bVar2;
        d_func((QObject *)0x3eca96);
        QBasicAtomicPointer<QObjectPrivate::ConnectionData>::loadRelaxed
                  ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)0x3ecaa2);
        local_d8 = (StaticMetaCallFunction)0x0;
        if ((*(uint *)&pCVar1->field_0x54 >> 0x1d & 1) != 0) {
          local_d8 = (pCVar1->field_6).callFunction;
          *(uint *)&pCVar1->field_0x54 = *(uint *)&pCVar1->field_0x54 & 0xdfffffff;
        }
        QObjectPrivate::ConnectionData::removeConnection(this_01,c_00);
        if (pQVar7 != pQVar11) {
          QMutexLocker<QBasicMutex>::unlock((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffe90);
        }
        QObjectPrivate::ConnectionData::cleanOrphanedConnections
                  ((ConnectionData *)in_stack_fffffffffffffea0,
                   (QObject *)CONCAT17(uVar12,in_stack_fffffffffffffe98),
                   (LockPolicy)((ulong)in_stack_fffffffffffffe90 >> 0x20));
        if (bVar2) {
          QBasicMutex::unlock((QBasicMutex *)in_stack_fffffffffffffea0);
        }
        if (pQVar7 == pQVar11) {
          QMutexLocker<QBasicMutex>::unlock((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffe90);
        }
        if (local_d8 != (StaticMetaCallFunction)0x0) {
          QtPrivate::QSlotObjectBase::destroyIfLastRef((QSlotObjectBase *)in_stack_fffffffffffffe90)
          ;
        }
        QMutexLocker<QBasicMutex>::relock((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffe90);
      }
      else {
        QBasicMutex::unlock((QBasicMutex *)in_stack_fffffffffffffea0);
      }
    }
    QBasicAtomicInteger<unsigned_int>::storeRelaxed
              ((QBasicAtomicInteger<unsigned_int> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe8c);
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_stack_fffffffffffffe90)
    ;
  }
  if (((pCVar6 != (Type)0x0) &&
      (bVar2 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x3ecbee), !bVar2)) &&
     (in_stack_fffffffffffffe90 = pCVar6, pCVar6 != (Type)0x0)) {
    QObjectPrivate::ConnectionData::~ConnectionData((ConnectionData *)in_stack_fffffffffffffea0);
    operator_delete(pCVar6,0x28);
    in_stack_fffffffffffffe90 = pCVar6;
  }
  QBasicAtomicPointer<QObjectPrivate::ConnectionData>::storeRelaxed
            ((QBasicAtomicPointer<QObjectPrivate::ConnectionData> *)in_stack_fffffffffffffe90,
             (Type)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  bVar2 = QList<QObject_*>::isEmpty((QList<QObject_*> *)0x3ecc46);
  if (!bVar2) {
    QObjectPrivate::deleteChildren(in_stack_fffffffffffffea0);
  }
  if (qtHookData[4] != 0) {
    (*(code *)qtHookData[4])(in_RDI);
  }
  if ((pQVar4->super_QObjectData).parent != (QObject *)0x0) {
    QObjectPrivate::setParent_helper
              ((QObjectPrivate *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee0);
  }
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_>::~QScopedPointer
            ((QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> *)
             in_stack_fffffffffffffe90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QObject::~QObject()
{
    Q_D(QObject);
    d->wasDeleted = true;
    d->blockSig = 0; // unblock signals so we always emit destroyed()

    if (!d->bindingStorage.isValid()) {
        // this might be the case after an incomplete thread-move
        // remove this object from the pending list in that case
        if (QThread *ownThread = thread()) {
            auto *privThread = static_cast<QThreadPrivate *>(
                        QObjectPrivate::get(ownThread));
            privThread->removeObjectWithPendingBindingStatusChange(this);
        }
    }

    // If we reached this point, we need to clear the binding data
    // as the corresponding properties are no longer useful
    d->clearBindingStorage();

    QtSharedPointer::ExternalRefCountData *sharedRefcount = d->sharedRefcount.loadRelaxed();
    if (sharedRefcount) {
        if (sharedRefcount->strongref.loadRelaxed() > 0) {
            qWarning("QObject: shared QObject was deleted directly. The program is malformed and may crash.");
            // but continue deleting, it's too late to stop anyway
        }

        // indicate to all QWeakPointers that this QObject has now been deleted
        sharedRefcount->strongref.storeRelaxed(0);
        if (!sharedRefcount->weakref.deref())
            delete sharedRefcount;
    }

    if (!d->wasWidget && d->isSignalConnected(0)) {
        emit destroyed(this);
    }

    if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::destroyed)
        QAbstractDeclarativeData::destroyed(d->declarativeData, this);

    QObjectPrivate::ConnectionData *cd = d->connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        QBasicMutex *signalSlotMutex = signalSlotLock(this);
        QMutexLocker locker(signalSlotMutex);

        // disconnect all receivers
        int receiverCount = cd->signalVectorCount();
        for (int signal = -1; signal < receiverCount; ++signal) {
            QObjectPrivate::ConnectionList &connectionList = cd->connectionsForSignal(signal);

            while (QObjectPrivate::Connection *c = connectionList.first.loadRelaxed()) {
                Q_ASSERT(c->receiver.loadAcquire());

                QBasicMutex *m = signalSlotLock(c->receiver.loadRelaxed());
                bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
                if (c == connectionList.first.loadAcquire() && c->receiver.loadAcquire()) {
                    cd->removeConnection(c);
                    Q_ASSERT(connectionList.first.loadRelaxed() != c);
                }
                if (needToUnlock)
                    m->unlock();
            }
        }

        /* Disconnect all senders:
         */
        while (QObjectPrivate::Connection *node = cd->senders) {
            Q_ASSERT(node->receiver.loadAcquire());
            QObject *sender = node->sender;
            // Send disconnectNotify before removing the connection from sender's connection list.
            // This ensures any eventual destructor of sender will block on getting receiver's lock
            // and not finish until we release it.
            sender->disconnectNotify(QMetaObjectPrivate::signal(sender->metaObject(), node->signal_index));
            QBasicMutex *m = signalSlotLock(sender);
            bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
            //the node has maybe been removed while the mutex was unlocked in relock?
            if (node != cd->senders) {
                // We hold the wrong mutex
                Q_ASSERT(needToUnlock);
                m->unlock();
                continue;
            }

            QObjectPrivate::ConnectionData *senderData = sender->d_func()->connections.loadRelaxed();
            Q_ASSERT(senderData);

            QtPrivate::QSlotObjectBase *slotObj = nullptr;
            if (node->isSlotObject) {
                slotObj = node->slotObj;
                node->isSlotObject = false;
            }

            senderData->removeConnection(node);
            /*
              When we unlock, another thread has the chance to delete/modify sender data.
              Thus we need to call cleanOrphanedConnections before unlocking. We use the
              variant of the function which assumes that the lock is already held to avoid
              a deadlock.
              We need to hold m, the sender lock. Considering that we might execute arbitrary user
              code, we should already release the signalSlotMutex here – unless they are the same.
            */
            const bool locksAreTheSame = signalSlotMutex == m;
            if (!locksAreTheSame)
                locker.unlock();
            senderData->cleanOrphanedConnections(
                        sender,
                        QObjectPrivate::ConnectionData::AlreadyLockedAndTemporarilyReleasingLock
                        );
            if (needToUnlock)
                m->unlock();

            if (locksAreTheSame) // otherwise already unlocked
                locker.unlock();
            if (slotObj)
                slotObj->destroyIfLastRef();
            locker.relock();
        }

        // invalidate all connections on the object and make sure
        // activate() will skip them
        cd->currentConnectionId.storeRelaxed(0);
    }
    if (cd && !cd->ref.deref())
        delete cd;
    d->connections.storeRelaxed(nullptr);

    if (!d->children.isEmpty())
        d->deleteChildren();

    if (Q_UNLIKELY(qtHookData[QHooks::RemoveQObject]))
        reinterpret_cast<QHooks::RemoveQObjectCallback>(qtHookData[QHooks::RemoveQObject])(this);

    Q_TRACE(QObject_dtor, this);

    if (d->parent)        // remove it from parent object
        d->setParent_helper(nullptr);
}